

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDress3.c
# Opt level: O0

void Abc_NtkDumpEquiv(Abc_Ntk_t **pNtks,char *pFileName,int nConfs,int fByName,int fVerbose)

{
  Gia_Man_t *pGia_00;
  char *pcVar1;
  char *pcVar2;
  Gia_Man_t *p;
  Vec_Int_t *vClasses_00;
  Gia_Man_t *pGia;
  Vec_Int_t *vClasses;
  Gia_Man_t *pTemp;
  int fVerbose_local;
  int fByName_local;
  int nConfs_local;
  char *pFileName_local;
  Abc_Ntk_t **pNtks_local;
  
  pGia_00 = Abc_NtkAigToGiaTwo(*pNtks,pNtks[1],fByName);
  if (fVerbose != 0) {
    pcVar1 = Abc_NtkName(*pNtks);
    pcVar2 = Abc_NtkName(pNtks[1]);
    printf("Computing equivalences for networks \"%s\" and \"%s\" with conflict limit %d.\n",pcVar1,
           pcVar2,(ulong)(uint)nConfs);
  }
  p = Gia_ManComputeGiaEquivs(pGia_00,nConfs,fVerbose);
  Gia_ManStop(p);
  if (fVerbose != 0) {
    Gia_ManPrintStats(pGia_00,(Gps_Par_t *)0x0);
  }
  vClasses_00 = Abc_NtkCollectEquivClasses(pNtks,pGia_00);
  Gia_ManStop(pGia_00);
  Abc_NtkDumpEquivFile(pFileName,vClasses_00,pNtks);
  Vec_IntFree(vClasses_00);
  return;
}

Assistant:

void Abc_NtkDumpEquiv( Abc_Ntk_t * pNtks[2], char * pFileName, int nConfs, int fByName, int fVerbose )
{
    //abctime clk = Abc_Clock();
    Gia_Man_t * pTemp;
    Vec_Int_t * vClasses;
    // derive shared AIG for the two networks
    Gia_Man_t * pGia = Abc_NtkAigToGiaTwo( pNtks[0], pNtks[1], fByName );
    if ( fVerbose )
        printf( "Computing equivalences for networks \"%s\" and \"%s\" with conflict limit %d.\n", Abc_NtkName(pNtks[0]), Abc_NtkName(pNtks[1]), nConfs );
    // compute equivalences in this AIG
    pTemp = Gia_ManComputeGiaEquivs( pGia, nConfs, fVerbose );
    Gia_ManStop( pTemp );
    //if ( fVerbose )
    //    Abc_PrintTime( 1, "Equivalence computation time", Abc_Clock() - clk );
    if ( fVerbose )
        Gia_ManPrintStats( pGia, NULL );
    // collect equivalence class information
    vClasses = Abc_NtkCollectEquivClasses( pNtks, pGia );
    Gia_ManStop( pGia );
    // dump information into the output file
    Abc_NtkDumpEquivFile( pFileName, vClasses, pNtks );
    Vec_IntFree( vClasses );
}